

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_fixups.cpp
# Opt level: O0

error_code __thiscall
pstore::exchange::import_ns::details::section_name::string_value(section_name *this,string *s)

{
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>_>
  *this_00;
  section_kind sVar1;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>_>
  __l;
  bool bVar2;
  int iVar3;
  pointer ppVar4;
  section_kind *psVar5;
  error_code eVar6;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
  *local_390;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>,_true>
  local_378;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>,_true>
  local_370;
  iterator pos;
  key_equal local_360;
  hasher local_35f;
  section_kind local_35e [37];
  section_kind local_339;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
  *local_338;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
  local_330;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
  local_308;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
  local_2e0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
  local_2b8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
  local_290;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
  local_268;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
  local_240;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
  local_218;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
  local_1f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
  local_1c8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
  local_1a0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
  local_178;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
  local_150;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
  local_128;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
  local_100;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
  local_d8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
  local_b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
  local_88;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
  local_60;
  iterator local_38;
  size_type local_30;
  string *local_28;
  string *s_local;
  section_name *this_local;
  error_category *local_10;
  
  local_28 = s;
  s_local = (string *)this;
  if (string_value(std::__cxx11::string_const&)::map_abi_cxx11_ == '\0') {
    iVar3 = __cxa_guard_acquire(&string_value(std::__cxx11::string_const&)::map_abi_cxx11_);
    if (iVar3 != 0) {
      local_338 = &local_330;
      local_339 = text;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
      ::pair<const_char_(&)[5],_pstore::repo::section_kind,_true>
                (local_338,(char (*) [5])"text",&local_339);
      local_338 = &local_308;
      local_35e[0x11] = 1;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
      ::pair<const_char_(&)[5],_pstore::repo::section_kind,_true>
                (local_338,(char (*) [5])0x1c5690,local_35e + 0x11);
      local_338 = &local_2e0;
      local_35e[0x10] = 2;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
      ::pair<const_char_(&)[4],_pstore::repo::section_kind,_true>
                (local_338,(char (*) [4])0x1c5a29,local_35e + 0x10);
      local_338 = &local_2b8;
      local_35e[0xf] = 3;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
      ::pair<const_char_(&)[7],_pstore::repo::section_kind,_true>
                (local_338,(char (*) [7])"rel_ro",local_35e + 0xf);
      local_338 = &local_290;
      local_35e[0xe] = 4;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
      ::pair<const_char_(&)[26],_pstore::repo::section_kind,_true>
                (local_338,(char (*) [26])"mergeable_1_byte_c_string",local_35e + 0xe);
      local_338 = &local_268;
      local_35e[0xd] = 5;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
      ::pair<const_char_(&)[26],_pstore::repo::section_kind,_true>
                (local_338,(char (*) [26])"mergeable_2_byte_c_string",local_35e + 0xd);
      local_338 = &local_240;
      local_35e[0xc] = 6;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
      ::pair<const_char_(&)[26],_pstore::repo::section_kind,_true>
                (local_338,(char (*) [26])"mergeable_4_byte_c_string",local_35e + 0xc);
      local_338 = &local_218;
      local_35e[0xb] = 7;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
      ::pair<const_char_(&)[18],_pstore::repo::section_kind,_true>
                (local_338,(char (*) [18])"mergeable_const_4",local_35e + 0xb);
      local_338 = &local_1f0;
      local_35e[10] = 8;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
      ::pair<const_char_(&)[18],_pstore::repo::section_kind,_true>
                (local_338,(char (*) [18])"mergeable_const_8",local_35e + 10);
      local_338 = &local_1c8;
      local_35e[9] = 9;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
      ::pair<const_char_(&)[19],_pstore::repo::section_kind,_true>
                (local_338,(char (*) [19])"mergeable_const_16",local_35e + 9);
      local_338 = &local_1a0;
      local_35e[8] = 10;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
      ::pair<const_char_(&)[19],_pstore::repo::section_kind,_true>
                (local_338,(char (*) [19])"mergeable_const_32",local_35e + 8);
      local_338 = &local_178;
      local_35e[7] = 0xb;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
      ::pair<const_char_(&)[10],_pstore::repo::section_kind,_true>
                (local_338,(char (*) [10])"read_only",local_35e + 7);
      local_338 = &local_150;
      local_35e[6] = 0xc;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
      ::pair<const_char_(&)[12],_pstore::repo::section_kind,_true>
                (local_338,(char (*) [12])"thread_data",local_35e + 6);
      local_338 = &local_128;
      local_35e[5] = 0xd;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
      ::pair<const_char_(&)[11],_pstore::repo::section_kind,_true>
                (local_338,(char (*) [11])"thread_bss",local_35e + 5);
      local_338 = &local_100;
      local_35e[4] = 0xe;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
      ::pair<const_char_(&)[11],_pstore::repo::section_kind,_true>
                (local_338,(char (*) [11])0x1c5d26,local_35e + 4);
      local_338 = &local_d8;
      local_35e[3] = 0xf;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
      ::pair<const_char_(&)[10],_pstore::repo::section_kind,_true>
                (local_338,(char (*) [10])"debug_loc",local_35e + 3);
      local_338 = &local_b0;
      local_35e[2] = 0x10;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
      ::pair<const_char_(&)[13],_pstore::repo::section_kind,_true>
                (local_338,(char (*) [13])"debug_string",local_35e + 2);
      local_338 = &local_88;
      local_35e[1] = 0x11;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
      ::pair<const_char_(&)[13],_pstore::repo::section_kind,_true>
                (local_338,(char (*) [13])"debug_ranges",local_35e + 1);
      local_338 = &local_60;
      local_35e[0] = linked_definitions;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
      ::pair<const_char_(&)[19],_pstore::repo::section_kind,_true>
                (local_338,(char (*) [19])"linked_definitions",local_35e);
      local_38 = &local_330;
      local_30 = 0x13;
      this_00 = (allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>_>
                 *)((long)&pos.
                           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>,_true>
                           ._M_cur + 7);
      std::
      allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>_>
      ::allocator(this_00);
      __l._M_len = local_30;
      __l._M_array = local_38;
      std::
      unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>_>_>
      ::unordered_map(&string_value(std::__cxx11::string_const&)::map_abi_cxx11_,__l,0,&local_35f,
                      &local_360,this_00);
      std::
      allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>_>
      ::~allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>_>
                    *)((long)&pos.
                              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>,_true>
                              ._M_cur + 7));
      local_390 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
                   *)&local_38;
      do {
        local_390 = local_390 + -1;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
        ::~pair(local_390);
      } while (local_390 != &local_330);
      __cxa_atexit(std::
                   unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>_>_>
                   ::~unordered_map,&string_value(std::__cxx11::string_const&)::map_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&string_value(std::__cxx11::string_const&)::map_abi_cxx11_);
    }
  }
  local_370._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>_>_>
       ::find(&string_value(std::__cxx11::string_const&)::map_abi_cxx11_,local_28);
  local_378._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>_>_>
       ::end(&string_value(std::__cxx11::string_const&)::map_abi_cxx11_);
  bVar2 = std::__detail::operator==(&local_370,&local_378);
  if (bVar2) {
    std::error_code::error_code<pstore::exchange::import_ns::error,void>
              ((error_code *)&this_local,unknown_section_name);
  }
  else {
    ppVar4 = std::__detail::
             _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>,_false,_true>
                           *)&local_370);
    sVar1 = ppVar4->second;
    psVar5 = gsl::not_null::operator_cast_to_section_kind_((not_null *)&this->section_);
    *psVar5 = sVar1;
    eVar6 = rule::pop(&this->super_rule);
    local_10 = eVar6._M_cat;
    this_local._0_4_ = eVar6._M_value;
  }
  eVar6._4_4_ = 0;
  eVar6._M_value = (uint)this_local;
  eVar6._M_cat = local_10;
  return eVar6;
}

Assistant:

std::error_code section_name::string_value (std::string const & s) {
                    // TODO: this map appears both here and in the fragment code.
#define X(a) {#a, pstore::repo::section_kind::a},
                    static std::unordered_map<std::string, repo::section_kind> map = {
                        PSTORE_MCREPO_SECTION_KINDS};
#undef X
                    auto const pos = map.find (s);
                    if (pos == map.end ()) {
                        return error::unknown_section_name;
                    }
                    *section_ = pos->second;
                    return pop ();
                }